

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O3

void find_mismatch_plane(aom_image_t *img1,aom_image_t *img2,int plane,int use_highbitdepth,int *loc
                        )

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  int local_f4;
  int local_f0;
  int local_ec;
  
  iVar14 = img1->stride[(uint)plane] >> ((byte)use_highbitdepth & 0x1f);
  iVar29 = img2->stride[(uint)plane] >> ((byte)use_highbitdepth & 0x1f);
  if (plane == 0) {
    uVar33 = img1->d_w;
    uVar23 = img1->d_h;
    uVar12 = 0x40;
    uVar31 = 0x40;
  }
  else {
    bVar6 = (byte)img1->x_chroma_shift;
    uVar12 = 0x40 >> (bVar6 & 0x1f);
    bVar7 = (byte)img1->y_chroma_shift;
    uVar31 = 0x40 >> (bVar7 & 0x1f);
    uVar33 = img1->x_chroma_shift + img1->d_w >> (bVar6 & 0x1f);
    uVar23 = img1->y_chroma_shift + img1->d_h >> (bVar7 & 0x1f);
  }
  puVar3 = img1->planes[(uint)plane];
  puVar4 = img2->planes[(uint)plane];
  *loc = -1;
  loc[1] = -1;
  loc[2] = -1;
  loc[3] = -1;
  if (((img1->monochrome == 0) || (plane == 0 || img2->monochrome == 0)) && (uVar23 != 0)) {
    iVar18 = 0;
    iVar27 = 1;
    iVar28 = 0;
    local_f4 = 1;
    uVar15 = 0;
    do {
      uVar21 = uVar15 + uVar31;
      if (uVar33 != 0) {
        uVar5 = uVar23 - uVar15;
        if (uVar21 < uVar23 - uVar15) {
          uVar5 = uVar21;
        }
        uVar24 = uVar23;
        if (uVar21 < uVar23) {
          uVar24 = uVar21;
        }
        iVar10 = 0;
        local_f0 = local_f4;
        uVar17 = 0;
        local_ec = iVar27;
        iVar2 = iVar18;
        iVar1 = iVar28;
        do {
          uVar19 = uVar17 + uVar12;
          if (plane == 0) {
            uVar8 = uVar33;
            if (uVar19 < uVar33) {
              uVar8 = uVar19;
            }
            uVar16 = uVar24 - uVar15;
            uVar8 = uVar8 - uVar17;
          }
          else {
            uVar16 = uVar5;
            uVar8 = uVar33 - uVar17;
            if (uVar19 < uVar33 - uVar17) {
              uVar8 = uVar19;
            }
          }
          if (0 < (int)uVar16) {
            iVar32 = 0;
            iVar26 = local_ec;
            iVar20 = local_f0;
            iVar34 = iVar2;
            iVar13 = iVar1;
            do {
              if (0 < (int)uVar8) {
                uVar11 = 0;
                iVar25 = iVar20;
                iVar30 = iVar26;
                do {
                  iVar9 = (int)uVar11;
                  if (use_highbitdepth == 0) {
                    uVar22 = (uint)puVar3[iVar13 + iVar9];
                    uVar17 = (uint)puVar4[iVar34 + iVar9];
                  }
                  else {
                    uVar22 = (uint)CONCAT11(puVar3[iVar25],puVar3[iVar25 + -1]);
                    uVar17 = (uint)CONCAT11(puVar4[iVar30],puVar4[iVar30 + -1]);
                  }
                  if (uVar22 != uVar17) {
                    *loc = uVar15 + iVar32;
                    loc[1] = iVar9 - iVar10;
                    loc[2] = uVar22;
                    loc[3] = uVar17;
                    return;
                  }
                  uVar11 = uVar11 + 1;
                  iVar25 = iVar25 + 2;
                  iVar30 = iVar30 + 2;
                } while (uVar8 != uVar11);
              }
              iVar32 = iVar32 + 1;
              iVar20 = iVar20 + iVar14 * 2;
              iVar13 = iVar13 + iVar14;
              iVar26 = iVar26 + iVar29 * 2;
              iVar34 = iVar34 + iVar29;
            } while (iVar32 < (int)uVar16);
          }
          iVar10 = iVar10 - uVar12;
          local_f0 = local_f0 + uVar12 * 2;
          iVar1 = iVar1 + uVar12;
          local_ec = local_ec + uVar12 * 2;
          iVar2 = iVar2 + uVar12;
          uVar17 = uVar19;
        } while (uVar19 < uVar33);
      }
      local_f4 = local_f4 + uVar31 * iVar14 * 2;
      iVar28 = iVar28 + uVar31 * iVar14;
      iVar27 = iVar27 + uVar31 * iVar29 * 2;
      iVar18 = iVar18 + uVar31 * iVar29;
      uVar15 = uVar21;
    } while (uVar21 < uVar23);
  }
  return;
}

Assistant:

static void find_mismatch_plane(const aom_image_t *const img1,
                                const aom_image_t *const img2, int plane,
                                int use_highbitdepth, int loc[4]) {
  const unsigned char *const p1 = img1->planes[plane];
  const int p1_stride = img1->stride[plane] >> use_highbitdepth;
  const unsigned char *const p2 = img2->planes[plane];
  const int p2_stride = img2->stride[plane] >> use_highbitdepth;
  const uint32_t bsize = 64;
  const int is_y_plane = (plane == AOM_PLANE_Y);
  const uint32_t bsizex = is_y_plane ? bsize : bsize >> img1->x_chroma_shift;
  const uint32_t bsizey = is_y_plane ? bsize : bsize >> img1->y_chroma_shift;
  const uint32_t c_w =
      is_y_plane ? img1->d_w
                 : (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      is_y_plane ? img1->d_h
                 : (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  assert(img1->d_w == img2->d_w && img1->d_h == img2->d_h);
  assert(img1->x_chroma_shift == img2->x_chroma_shift &&
         img1->y_chroma_shift == img2->y_chroma_shift);
  loc[0] = loc[1] = loc[2] = loc[3] = -1;
  if (img1->monochrome && img2->monochrome && plane) return;
  int match = 1;
  uint32_t i, j;
  for (i = 0; match && i < c_h; i += bsizey) {
    for (j = 0; match && j < c_w; j += bsizex) {
      const int si =
          is_y_plane ? mmin(i + bsizey, c_h) - i : mmin(i + bsizey, c_h - i);
      const int sj =
          is_y_plane ? mmin(j + bsizex, c_w) - j : mmin(j + bsizex, c_w - j);
      int k, l;
      for (k = 0; match && k < si; ++k) {
        for (l = 0; match && l < sj; ++l) {
          const int row = i + k;
          const int col = j + l;
          const int offset1 = row * p1_stride + col;
          const int offset2 = row * p2_stride + col;
          const int val1 = use_highbitdepth
                               ? p1[2 * offset1] | (p1[2 * offset1 + 1] << 8)
                               : p1[offset1];
          const int val2 = use_highbitdepth
                               ? p2[2 * offset2] | (p2[2 * offset2 + 1] << 8)
                               : p2[offset2];
          if (val1 != val2) {
            loc[0] = row;
            loc[1] = col;
            loc[2] = val1;
            loc[3] = val2;
            match = 0;
            break;
          }
        }
      }
    }
  }
}